

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode_traits.hpp
# Opt level: O3

void jsoncons::encode_traits<__int128,char,void>::
     encode<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
               (undefined8 *param_1,basic_json_visitor<char> *param_2,undefined8 param_3,
               error_code *param_4)

{
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> j;
  __int128 in_stack_ffffffffffffffc8;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> local_28;
  
  basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::
  basic_json<__int128>(__int128,jsoncons::semantic_tag,std::allocator<char>const&,std::
  enable_if<ext_traits::is_signed_integer<__int128>::value&&((8ul)<(sizeof(__int128))),int>::type_
            (&local_28,in_stack_ffffffffffffffc8,(semantic_tag)*param_1,
             (allocator<char> *)param_1[1],0);
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::dump_noflush
            (&local_28,param_2,param_4);
  if (param_4->_M_value == 0) {
    (*param_2->_vptr_basic_json_visitor[2])(param_2);
  }
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::destroy(&local_28);
  return;
}

Assistant:

static void encode(std::true_type,
                           const T& val, 
                           basic_json_visitor<CharT>& encoder,
                           const Json& /*proto*/, 
                           std::error_code& ec)
        {
            auto j = json_type_traits<Json,T>::to_json(val);
            j.dump(encoder, ec);
        }